

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O0

long __thiscall libtorrent::aux::random(aux *this)

{
  mt19937 *__urng;
  uniform_int_distribution<unsigned_int> local_1c;
  uint local_10;
  result_type_conflict ret;
  uint32_t max_local;
  
  local_10 = (uint)this;
  if (local_10 == 0) {
    ret = 0;
  }
  else {
    ::std::uniform_int_distribution<unsigned_int>::uniform_int_distribution(&local_1c,0,local_10);
    __urng = random_engine();
    ret = ::std::uniform_int_distribution<unsigned_int>::operator()(&local_1c,__urng);
  }
  return (ulong)ret;
}

Assistant:

std::uint32_t random(std::uint32_t const max)
	{
		if (max == 0) return 0;
#ifdef BOOST_NO_CXX11_THREAD_LOCAL
		std::lock_guard<std::mutex> l(rng_mutex);
#endif
#ifdef TORRENT_BUILD_SIMULATOR
		std::uint32_t mask = max | (max >> 16);
		mask |= mask >> 8;
		mask |= mask >> 4;
		mask |= mask >> 2;
		mask |= mask >> 1;
		auto& rng = aux::random_engine();
		std::uint32_t ret;
		do
		{
			ret = rng() & mask;
		} while (ret > max);
#else
		auto const ret = std::uniform_int_distribution<std::uint32_t>(0, max)(aux::random_engine());
#endif
		return ret;
	}